

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCubeArray
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,int *faceArrayIndices)

{
  int iVar1;
  pointer pVVar2;
  float *pfVar3;
  int local_30;
  int local_2c;
  int vertexNdx;
  int quadNdx;
  iterator vertexItr;
  int *faceArrayIndices_local;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  vertexItr._M_current._7_1_ = 0;
  createQuadMosaicCube();
  _vertexNdx = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::begin(__return_storage_ptr__);
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      iVar1 = faceArrayIndices[local_2c];
      pVVar2 = __gnu_cxx::
               __normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
               ::operator->((__normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
                             *)&vertexNdx);
      pfVar3 = tcu::Vector<float,_4>::w(&pVVar2->texCoord);
      *pfVar3 = (float)iVar1;
      __gnu_cxx::
      __normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
      ::operator++((__normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
                    *)&vertexNdx,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCubeArray (int faceArrayIndices[6])
{
	std::vector<Vertex4Tex4>			vertices	= createQuadMosaicCube();
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.w() = (float)faceArrayIndices[quadNdx];
			vertexItr++;
		}
	}

	return vertices;
}